

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::RandomShaderCase::checkShaderLimits(RandomShaderCase *this,Shader *shader)

{
  pointer ppSVar1;
  int iVar2;
  const_iterator it;
  pointer ppSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  long *plVar4;
  size_type *psVar5;
  undefined4 uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  int numSupported;
  int numRequiredSamplers;
  int local_c8;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ppSVar3 = (shader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (shader->m_uniforms).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar3 != ppSVar1) {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)((((*ppSVar3)->m_variable->m_type).m_baseType & ~TYPE_FLOAT) ==
                            TYPE_SAMPLER_2D);
      ppSVar3 = ppSVar3 + 1;
    } while (ppSVar3 != ppSVar1);
    if (0 < iVar7) {
      uVar6 = 0x8872;
      if (shader->m_type == TYPE_VERTEX) {
        uVar6 = 0x8b4c;
      }
      local_c8 = -1;
      local_c4 = iVar7;
      iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(uVar6,&local_c8);
      iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
      local_60._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
      if ((int)local_60._M_string_length != 0) {
        auVar8 = __cxa_allocate_exception(0x38);
        local_60._M_dataplus._M_p = (pointer)glu::getErrorName;
        de::toString<tcu::Format::Enum<int,2ul>>(&local_c0,(de *)&local_60,auVar8._8_8_);
        std::operator+(&local_a0,"Limit query failed: ",&local_c0);
        tcu::TestError::TestError(auVar8._0_8_,&local_a0);
        __cxa_throw(auVar8._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (local_c8 < iVar7) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        de::toString<int>(&local_80,&local_c4);
        std::operator+(&local_60,"Shader requires ",&local_80);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_c0._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_c0._M_dataplus._M_p == psVar5) {
          local_c0.field_2._M_allocated_capacity = *psVar5;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar5;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        de::toString<int>(&local_40,&local_c8);
        std::operator+(&local_a0,&local_c0,&local_40);
        tcu::NotSupportedError::NotSupportedError(this_00,&local_a0);
        __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkShaderLimits (const rsg::Shader& shader) const
{
	const int numRequiredSamplers = getNumSamplerUniforms(shader.getUniforms());

	if (numRequiredSamplers > 0)
	{
		const GLenum	pname			= (shader.getType() == rsg::Shader::TYPE_VERTEX) ? (GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS) : (GL_MAX_TEXTURE_IMAGE_UNITS);
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(pname, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredSamplers)
			throw tcu::NotSupportedError("Shader requires " + de::toString(numRequiredSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}